

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::SelectNth
          (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *this,
          SubFrames *frames,idx_t n)

{
  pointer puVar1;
  size_type sVar2;
  pointer pFVar3;
  pointer pFVar4;
  uint *puVar5;
  ulong uVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  vector<unsigned_int,_true> *this_00;
  const_reference pvVar9;
  long *plVar10;
  uint *puVar11;
  size_type __n;
  ulong uVar12;
  uint *puVar13;
  ulong uVar14;
  uint *puVar15;
  size_type sVar16;
  pointer puVar17;
  long lVar18;
  ulong uVar19;
  uint *puVar20;
  pointer pFVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  idx_t iVar25;
  unsigned_long uVar26;
  long lVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  pair<unsigned_long,_unsigned_long> pVar30;
  array<std::pair<unsigned_long,_unsigned_long>,_3UL> cascades;
  array<std::pair<unsigned_long,_unsigned_long>,_3UL> matches;
  ulong local_e8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar19 = ((long)(this->tree).
                  super_vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                  .
                  super__Vector_base<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->tree).
                  super_vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                  .
                  super__Vector_base<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  if (uVar19 < 2) {
    uVar26 = 0;
    uVar14 = 0;
  }
  else {
    uVar14 = 1;
    __n = uVar19 - 2;
    for (uVar6 = __n; uVar6 != 0; uVar6 = uVar6 - 1) {
      uVar14 = uVar14 << 5;
    }
    if (__n < 3) {
      local_e8 = 0;
    }
    else {
      local_78 = (undefined1  [16])0x0;
      local_88 = (undefined1  [16])0x0;
      local_98 = (undefined1  [16])0x0;
      pvVar7 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
               ::operator[](&this->tree,uVar19 - 1);
      if ((frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
          super__Vector_impl_data._M_start) {
        sVar16 = 0;
        do {
          pvVar8 = vector<duckdb::FrameBounds,_true>::operator[](frames,sVar16);
          puVar15 = (pvVar7->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar19 = (long)(pvVar7->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar15 >> 2;
          puVar20 = puVar15;
          if ((long)uVar19 < 1) {
            *(ulong *)(local_98 + sVar16 * 0x10) = 0;
          }
          else {
            puVar11 = puVar15;
            uVar6 = uVar19;
            do {
              uVar23 = uVar6 >> 1;
              uVar6 = ~uVar23 + uVar6;
              puVar13 = puVar11 + uVar23 + 1;
              if (pvVar8->start <= (ulong)puVar11[uVar23]) {
                uVar6 = uVar23;
                puVar13 = puVar11;
              }
              puVar11 = puVar13;
            } while (0 < (long)uVar6);
            *(ulong *)(local_98 + sVar16 * 0x10) =
                 (long)puVar11 - (long)puVar15 >> 2 & 0xffffffffffffffe0;
            if (0 < (long)uVar19) {
              do {
                uVar6 = uVar19 >> 1;
                uVar19 = ~uVar6 + uVar19;
                puVar11 = puVar20 + uVar6 + 1;
                if (pvVar8->end <= (ulong)puVar20[uVar6]) {
                  uVar19 = uVar6;
                  puVar11 = puVar20;
                }
                puVar20 = puVar11;
              } while (0 < (long)uVar19);
            }
          }
          *(ulong *)(local_98 + sVar16 * 0x10 + 8) =
               (long)puVar20 - (long)puVar15 >> 2 & 0xffffffffffffffe0;
          sVar16 = sVar16 + 1;
        } while (sVar16 < (ulong)((long)(frames->
                                        super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                        ).
                                        super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(frames->
                                        super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                        ).
                                        super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      local_e8 = 0;
      uVar19 = __n;
      do {
        pvVar7 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::operator[](&this->tree,uVar19 + 1);
        this_00 = &pvVar7->second;
        pvVar7 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::operator[](&this->tree,uVar19);
        puVar1 = (pvVar7->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar25 = n;
        do {
          local_48 = (undefined1  [16])0x0;
          local_58 = (undefined1  [16])0x0;
          local_68 = (undefined1  [16])0x0;
          if ((frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
              super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
              super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar6 = 0;
            uVar23 = 0;
          }
          else {
            uVar23 = 0;
            sVar16 = 0;
            do {
              pvVar8 = vector<duckdb::FrameBounds,_true>::operator[](frames,sVar16);
              lVar24 = sVar16 * 0x10;
              sVar2 = *(size_type *)(local_98 + lVar24);
              pvVar9 = vector<unsigned_int,_true>::operator[](this_00,sVar2);
              uVar12 = (ulong)*pvVar9;
              puVar17 = puVar1 + uVar12;
              pvVar9 = vector<unsigned_int,_true>::operator[](this_00,sVar2 + 0x20);
              uVar6 = *pvVar9 - uVar12;
              if (uVar6 != 0 && uVar12 <= *pvVar9) {
                do {
                  uVar12 = uVar6 >> 1;
                  uVar22 = ~uVar12 + uVar6;
                  uVar6 = uVar12;
                  if ((ulong)(puVar17 + uVar12 + 1)[0xffffffffffffffff] < pvVar8->start) {
                    puVar17 = puVar17 + uVar12 + 1;
                    uVar6 = uVar22;
                  }
                } while (0 < (long)uVar6);
              }
              lVar18 = (long)puVar17 - (long)puVar1 >> 2;
              *(long *)(local_68 + lVar24) = lVar18;
              sVar2 = *(size_type *)(local_98 + lVar24 + 8);
              pvVar9 = vector<unsigned_int,_true>::operator[](this_00,sVar2);
              uVar12 = (ulong)*pvVar9;
              puVar15 = puVar1 + uVar12;
              pvVar9 = vector<unsigned_int,_true>::operator[](this_00,sVar2 + 0x20);
              uVar6 = *pvVar9 - uVar12;
              if (uVar6 != 0 && uVar12 <= *pvVar9) {
                do {
                  uVar12 = uVar6 >> 1;
                  uVar22 = ~uVar12 + uVar6;
                  uVar6 = uVar12;
                  if ((ulong)puVar15[uVar12] < pvVar8->end) {
                    puVar15 = puVar15 + uVar12 + 1;
                    uVar6 = uVar22;
                  }
                } while (0 < (long)uVar6);
              }
              lVar27 = (long)puVar15 - (long)puVar1 >> 2;
              *(long *)(local_68 + lVar24 + 8) = lVar27;
              uVar23 = (uVar23 - lVar18) + lVar27;
              sVar16 = sVar16 + 1;
              uVar6 = (long)(frames->
                            super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>)
                            .
                            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(frames->
                            super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>)
                            .
                            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4;
            } while (sVar16 < uVar6);
          }
          if (iVar25 < uVar23) {
            n = iVar25;
            if (uVar6 != 0) {
              auVar29._8_4_ = (int)local_e8;
              auVar29._0_8_ = local_e8;
              auVar29._12_4_ = (int)(local_e8 >> 0x20);
              lVar24 = 0;
              do {
                uVar12 = *(ulong *)(local_68 + lVar24 + 8);
                *(ulong *)(local_98 + lVar24) =
                     (*(ulong *)(local_68 + lVar24) & 0xffffffffffffffe0) + local_e8 * 0x40;
                *(ulong *)(local_98 + lVar24 + 8) =
                     (uVar12 & 0xffffffffffffffe0) + auVar29._8_8_ * 0x40;
                lVar24 = lVar24 + 0x10;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 0);
            }
          }
          else {
            if (uVar6 != 0) {
              plVar10 = (long *)local_98;
              do {
                *plVar10 = *plVar10 + 1;
                plVar10[1] = plVar10[1] + 1;
                plVar10 = plVar10 + 2;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 0);
            }
            local_e8 = local_e8 + 1;
            n = iVar25 - uVar23;
          }
          bVar28 = uVar23 <= iVar25;
          iVar25 = n;
        } while (bVar28);
        local_e8 = local_e8 << 5;
        uVar14 = uVar14 >> 5;
        __n = uVar19 - 1;
        bVar28 = 2 < uVar19;
        uVar19 = __n;
      } while (bVar28);
    }
    for (; __n != 0; __n = __n - 1) {
      pvVar7 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
               ::operator[](&this->tree,__n);
      puVar15 = (pvVar7->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start + uVar14 * local_e8;
      while (puVar20 = puVar15 + uVar14,
            puVar20 < (pvVar7->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
        if ((frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar19 = 0;
        }
        else {
          uVar6 = (long)puVar20 - (long)puVar15 >> 2;
          uVar19 = 0;
          sVar16 = 0;
          do {
            pvVar8 = vector<duckdb::FrameBounds,_true>::operator[](frames,sVar16);
            puVar11 = puVar15;
            if (0 < (long)uVar6) {
              uVar23 = uVar6;
              do {
                uVar12 = uVar23 >> 1;
                uVar23 = ~uVar12 + uVar23;
                puVar13 = puVar11 + uVar12 + 1;
                if (pvVar8->start <= (ulong)puVar11[uVar12]) {
                  uVar23 = uVar12;
                  puVar13 = puVar11;
                }
                puVar11 = puVar13;
              } while (0 < (long)uVar23);
            }
            uVar23 = (long)puVar20 - (long)puVar11 >> 2;
            puVar13 = puVar11;
            if (0 < (long)uVar23) {
              do {
                uVar12 = uVar23 >> 1;
                uVar23 = ~uVar12 + uVar23;
                puVar5 = puVar13 + uVar12 + 1;
                if (pvVar8->end <= (ulong)puVar13[uVar12]) {
                  uVar23 = uVar12;
                  puVar5 = puVar13;
                }
                puVar13 = puVar5;
              } while (0 < (long)uVar23);
            }
            uVar19 = uVar19 + ((long)puVar13 - (long)puVar11 >> 2);
            sVar16 = sVar16 + 1;
          } while (sVar16 < (ulong)((long)(frames->
                                          super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ).
                                          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(frames->
                                          super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ).
                                          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        if (n < uVar19) break;
        local_e8 = local_e8 + 1;
        puVar15 = puVar20;
        n = n - uVar19;
      }
      local_e8 = local_e8 << 5;
      uVar14 = uVar14 >> 5;
    }
    pvVar7 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
             ::operator[](&this->tree,0);
    puVar1 = (pvVar7->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar26 = n + 1;
    pvVar7 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
             ::operator[](&this->tree,0);
    uVar19 = (long)(pvVar7->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pvVar7->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    if (local_e8 + 0x20 < uVar19) {
      uVar19 = local_e8 + 0x20;
    }
    uVar14 = local_e8;
    if (local_e8 < uVar19) {
      pFVar3 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
               super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl
               .super__Vector_impl_data._M_start;
      pFVar4 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
               super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl
               .super__Vector_impl_data._M_finish;
      do {
        if (pFVar3 != pFVar4) {
          uVar14 = (ulong)puVar1[local_e8];
          pFVar21 = pFVar3;
          do {
            uVar26 = uVar26 - (uVar14 < pFVar21->end && pFVar21->start <= uVar14);
            pFVar21 = pFVar21 + 1;
          } while (pFVar21 != pFVar4);
        }
        uVar14 = local_e8;
      } while ((uVar26 != 0) && (local_e8 = local_e8 + 1, uVar14 = uVar19, local_e8 != uVar19));
    }
  }
  pVar30.second = uVar26;
  pVar30.first = uVar14;
  return pVar30;
}

Assistant:

pair<idx_t, idx_t> MergeSortTree<E, O, CMP, F, C>::SelectNth(const SubFrames &frames, idx_t n) const {
	// Handle special case of a one-element tree
	if (tree.size() < 2) {
		return {0, 0};
	}

	// 	The first level contains a single run,
	//	so the only thing we need is any cascading pointers
	auto level_no = tree.size() - 2;
	idx_t level_width = 1;
	for (idx_t i = 0; i < level_no; ++i) {
		level_width *= FANOUT;
	}

	// Find Nth element in a top-down traversal
	idx_t result = 0;

	// First, handle levels with cascading pointers
	const auto min_cascaded = LowestCascadingLevel();
	if (level_no > min_cascaded) {
		//	Initialise the cascade indicies from the previous level
		using CascadeRange = pair<idx_t, idx_t>;
		std::array<CascadeRange, 3> cascades;
		const auto &level = tree[level_no + 1].first;
		for (idx_t f = 0; f < frames.size(); ++f) {
			const auto &frame = frames[f];
			auto &cascade_idx = cascades[f];
			const auto lower_idx =
			    UnsafeNumericCast<idx_t>(std::lower_bound(level.begin(), level.end(), frame.start) - level.begin());
			cascade_idx.first = lower_idx / CASCADING * FANOUT;
			const auto upper_idx =
			    UnsafeNumericCast<idx_t>(std::lower_bound(level.begin(), level.end(), frame.end) - level.begin());
			cascade_idx.second = upper_idx / CASCADING * FANOUT;
		}

		// 	Walk the cascaded levels
		for (; level_no >= min_cascaded; --level_no) {
			//	The cascade indicies into this level are in the previous level
			const auto &level_cascades = tree[level_no + 1].second;

			// Go over all children until we found enough in range
			const auto *level_data = tree[level_no].first.data();
			while (true) {
				idx_t matched = 0;
				std::array<CascadeRange, 3> matches;
				for (idx_t f = 0; f < frames.size(); ++f) {
					const auto &frame = frames[f];
					auto &cascade_idx = cascades[f];
					auto &match = matches[f];

					const auto lower_begin = level_data + level_cascades[cascade_idx.first];
					const auto lower_end = level_data + level_cascades[cascade_idx.first + FANOUT];
					match.first =
					    UnsafeNumericCast<idx_t>(std::lower_bound(lower_begin, lower_end, frame.start) - level_data);

					const auto upper_begin = level_data + level_cascades[cascade_idx.second];
					const auto upper_end = level_data + level_cascades[cascade_idx.second + FANOUT];
					match.second =
					    UnsafeNumericCast<idx_t>(std::lower_bound(upper_begin, upper_end, frame.end) - level_data);

					matched += idx_t(match.second - match.first);
				}
				if (matched > n) {
					// 	Too much in this level, so move down to leftmost child candidate within the cascade range
					for (idx_t f = 0; f < frames.size(); ++f) {
						auto &cascade_idx = cascades[f];
						auto &match = matches[f];
						cascade_idx.first = (match.first / CASCADING + 2 * result) * FANOUT;
						cascade_idx.second = (match.second / CASCADING + 2 * result) * FANOUT;
					}
					break;
				}

				//	Not enough in this child, so move right
				for (idx_t f = 0; f < frames.size(); ++f) {
					auto &cascade_idx = cascades[f];
					++cascade_idx.first;
					++cascade_idx.second;
				}
				++result;
				n -= matched;
			}
			result *= FANOUT;
			level_width /= FANOUT;
		}
	}

	//	Continue with the uncascaded levels (except the first)
	for (; level_no > 0; --level_no) {
		const auto &level = tree[level_no].first;
		auto range_begin = level.begin() + UnsafeNumericCast<int64_t>(result * level_width);
		auto range_end = range_begin + UnsafeNumericCast<int64_t>(level_width);
		while (range_end < level.end()) {
			idx_t matched = 0;
			for (idx_t f = 0; f < frames.size(); ++f) {
				const auto &frame = frames[f];
				const auto lower_match = std::lower_bound(range_begin, range_end, frame.start);
				const auto upper_match = std::lower_bound(lower_match, range_end, frame.end);
				matched += idx_t(upper_match - lower_match);
			}
			if (matched > n) {
				// 	Too much in this level, so move down to leftmost child candidate
				//	Since we have no cascade pointers left, this is just the start of the next level.
				break;
			}
			//	Not enough in this child, so move right
			range_begin = range_end;
			range_end += UnsafeNumericCast<int64_t>(level_width);
			++result;
			n -= matched;
		}
		result *= FANOUT;
		level_width /= FANOUT;
	}

	// The last level
	const auto *level_data = tree[level_no].first.data();
	++n;

	const auto count = tree[level_no].first.size();
	for (const auto limit = MinValue<idx_t>(result + FANOUT, count); result < limit; ++result) {
		const auto v = level_data[result];
		for (const auto &frame : frames) {
			n -= (v >= frame.start) && (v < frame.end);
		}
		if (!n) {
			break;
		}
	}

	return {result, n};
}